

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifSat.c
# Opt level: O2

void * If_ManSatBuildXY(int nLutSize)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  sat_solver *s;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  undefined4 in_register_0000003c;
  uint uVar9;
  uint uVar10;
  int local_7c;
  int local_78;
  uint local_74;
  int local_70;
  int local_6c;
  sat_solver *local_68;
  ulong local_60;
  ulong local_58;
  undefined8 local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_50 = CONCAT44(in_register_0000003c,nLutSize);
  bVar1 = (byte)nLutSize;
  uVar5 = 1 << (bVar1 * '\x02' - 1 & 0x1f);
  uVar9 = 2 << (bVar1 & 0x1f);
  s = sat_solver_new();
  sat_solver_setnvars(s,uVar5 + uVar9);
  uVar8 = 0;
  local_48 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    local_48 = uVar8;
  }
  uVar5 = uVar9 * 2;
  local_68 = s;
  local_60 = (ulong)(uint)(1 << (bVar1 & 0x1f));
  local_58 = (ulong)uVar9;
  while( true ) {
    uVar9 = (uint)uVar8;
    if ((uint)local_48 == uVar9) {
      return s;
    }
    uVar4 = uVar9 >> ((byte)local_50 & 0x1f);
    iVar3 = (int)local_60;
    uVar10 = iVar3 + uVar4 * 2;
    uVar4 = iVar3 + uVar4 * 2 + 1;
    if ((int)((int)local_58 + uVar9 | uVar10 | uVar4) < 0) {
      __assert_fail("iVarC >= 0 && iVarT >= 0 && iVarE >= 0 && iVarZ >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                    ,0x1c7,
                    "int sat_solver_add_mux(sat_solver *, int, int, int, int, int, int, int, int)");
    }
    iVar6 = ((int)uVar9 % iVar3) * 2 + 1;
    local_78 = uVar4 * 2 + 1;
    local_7c = iVar6;
    local_74 = uVar5;
    local_6c = local_78;
    local_38 = uVar8;
    iVar2 = sat_solver_addclause(s,&local_7c,&local_70);
    if (iVar2 == 0) {
      __assert_fail("Cid",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                    ,0x1cd,
                    "int sat_solver_add_mux(sat_solver *, int, int, int, int, int, int, int, int)");
    }
    iVar7 = uVar5 + 1;
    local_7c = iVar6;
    local_78 = uVar4 * 2;
    local_74 = iVar7;
    iVar2 = sat_solver_addclause(local_68,&local_7c,&local_70);
    s = local_68;
    if (iVar2 == 0) {
      __assert_fail("Cid",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                    ,0x1d3,
                    "int sat_solver_add_mux(sat_solver *, int, int, int, int, int, int, int, int)");
    }
    iVar3 = ((int)uVar9 % iVar3) * 2;
    local_78 = uVar10 * 2 + 1;
    local_7c = iVar3;
    local_74 = uVar5;
    local_70 = local_78;
    local_40 = (ulong)uVar5;
    iVar2 = sat_solver_addclause(local_68,&local_7c,&local_70);
    if (iVar2 == 0) {
      __assert_fail("Cid",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                    ,0x1d9,
                    "int sat_solver_add_mux(sat_solver *, int, int, int, int, int, int, int, int)");
    }
    local_7c = iVar3;
    local_78 = uVar10 * 2;
    local_74 = iVar7;
    iVar3 = sat_solver_addclause(s,&local_7c,&local_70);
    if (iVar3 == 0) {
      __assert_fail("Cid",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                    ,0x1df,
                    "int sat_solver_add_mux(sat_solver *, int, int, int, int, int, int, int, int)");
    }
    local_7c = uVar4 * 2;
    local_78 = uVar10 * 2;
    local_74 = iVar7;
    iVar3 = sat_solver_addclause(s,&local_7c,&local_70);
    if (iVar3 == 0) {
      __assert_fail("Cid",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                    ,0x1e8,
                    "int sat_solver_add_mux(sat_solver *, int, int, int, int, int, int, int, int)");
    }
    local_7c = local_6c;
    local_78 = local_70;
    iVar2 = (int)local_40;
    local_74 = iVar2;
    iVar3 = sat_solver_addclause(s,&local_7c,&local_70);
    if (iVar3 == 0) break;
    uVar8 = (ulong)((int)local_38 + 1);
    uVar5 = iVar2 + 2;
  }
  __assert_fail("Cid",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                ,0x1ee,
                "int sat_solver_add_mux(sat_solver *, int, int, int, int, int, int, int, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////
 
/**Function*************************************************************

  Synopsis    [Builds SAT instance for the given structure.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void * If_ManSatBuildXY( int nLutSize )
{
    int nMintsL = (1 << nLutSize);
    int nMintsF = (1 << (2 * nLutSize - 1));
    int nVars   = 2 * nMintsL + nMintsF;
    int iVarP0  = 0;           // LUT0 parameters (total nMintsL)
    int iVarP1  = nMintsL;     // LUT1 parameters (total nMintsL)
    int m,iVarM = 2 * nMintsL; // MUX vars        (total nMintsF)
    sat_solver * p = sat_solver_new();
    sat_solver_setnvars( p, nVars );
    for ( m = 0; m < nMintsF; m++ )
        sat_solver_add_mux( p, 
            iVarM  + m, 
            iVarP0 + m % nMintsL, 
            iVarP1 + 2 * (m / nMintsL) + 1, 
            iVarP1 + 2 * (m / nMintsL), 
            0, 0, 0, 0 );
    return p;
}